

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O0

int DIR_mkdir(void *opaque,char *name)

{
  undefined1 *ptr;
  char *path;
  size_t sVar1;
  size_t sVar2;
  ulong len_00;
  char *buf;
  char *pcVar3;
  undefined1 *puVar4;
  undefined1 auStack_68 [8];
  undefined1 *local_60;
  size_t local_58;
  char *local_50;
  char *local_48;
  size_t local_40;
  size_t local_38;
  size_t len;
  char *f;
  char *pcStack_20;
  int retval;
  char *name_local;
  void *opaque_local;
  
  puVar4 = auStack_68;
  pcStack_20 = name;
  name_local = (char *)opaque;
  if (opaque == (void *)0x0) {
    local_40 = 0;
  }
  else {
    local_40 = strlen((char *)opaque);
  }
  local_58 = local_40;
  sVar2 = strlen(pcStack_20);
  len_00 = local_58 + sVar2 + 1;
  local_50 = name_local;
  local_48 = pcStack_20;
  if (len_00 < 0x100) {
    puVar4 = auStack_68 + -(local_58 + sVar2 + 0x18 & 0xfffffffffffffff0);
    local_60 = puVar4;
  }
  else {
    local_60 = (undefined1 *)0x0;
  }
  ptr = local_60;
  local_38 = len_00;
  *(undefined8 *)(puVar4 + -8) = 0x11162b;
  buf = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
  sVar1 = local_38;
  path = local_48;
  pcVar3 = local_50;
  *(undefined8 *)(puVar4 + -8) = 0x11163f;
  pcVar3 = cvtToDependent(pcVar3,path,buf,sVar1);
  if (pcVar3 == (char *)0x0) {
    opaque_local._4_4_ = 0;
  }
  else {
    len = (size_t)pcVar3;
    *(undefined8 *)(puVar4 + -8) = 0x11165e;
    f._4_4_ = __PHYSFS_platformMkDir(pcVar3);
    sVar1 = len;
    *(undefined8 *)(puVar4 + -8) = 0x11166a;
    __PHYSFS_smallFree((void *)sVar1);
    opaque_local._4_4_ = f._4_4_;
  }
  return opaque_local._4_4_;
}

Assistant:

static int DIR_mkdir(void *opaque, const char *name)
{
    int retval;
    char *f;

    CVT_TO_DEPENDENT(f, opaque, name);
    BAIL_IF_ERRPASS(!f, 0);
    retval = __PHYSFS_platformMkDir(f);
    __PHYSFS_smallFree(f);
    return retval;
}